

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void pipe2_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_pipe_t *handle;
  uv_loop_t *puVar3;
  pinger_t *pinger;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t fds [2];
  uv_os_fd_t local_28;
  uv_os_fd_t local_24;
  
  iVar1 = uv_pipe(&local_28,0x40,0x40);
  if (iVar1 == 0) {
    uVar2 = uv_guess_handle(local_28);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001ac03a;
    uVar2 = uv_guess_handle(local_24);
    if (uVar2 != UV_NAMED_PIPE) goto LAB_001ac047;
    handle = (uv_pipe_t *)malloc(0xe8);
    if (handle == (uv_pipe_t *)0x0) goto LAB_001ac054;
    puVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar3,handle,0);
    if (iVar1 != 0) goto LAB_001ac059;
    iVar1 = uv_pipe_open(handle,local_28);
    if (iVar1 != 0) goto LAB_001ac066;
    pinger = (pinger_t *)malloc(0x168);
    if (pinger == (pinger_t *)0x0) goto LAB_001ac073;
    pinger->vectored_writes = vectored_writes;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PING;
    puVar3 = uv_default_loop();
    iVar1 = uv_pipe_init(puVar3,&(pinger->stream).pipe,0);
    if (iVar1 != 0) goto LAB_001ac078;
    iVar1 = uv_pipe_open(&(pinger->stream).pipe,local_24);
    if (iVar1 == 0) {
      (pinger->stream).tcp.data = pinger;
      handle->data = pinger;
      pinger_write_ping(pinger);
      iVar1 = uv_read_start((uv_stream_t *)handle,alloc_cb,pinger_read_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001ac092;
    }
  }
  else {
    pipe2_pinger_new_cold_1();
LAB_001ac03a:
    pipe2_pinger_new_cold_2();
LAB_001ac047:
    pipe2_pinger_new_cold_3();
LAB_001ac054:
    pipe2_pinger_new_cold_10();
LAB_001ac059:
    pipe2_pinger_new_cold_4();
LAB_001ac066:
    pipe2_pinger_new_cold_5();
LAB_001ac073:
    pipe2_pinger_new_cold_9();
LAB_001ac078:
    pipe2_pinger_new_cold_6();
  }
  pipe2_pinger_new_cold_7();
LAB_001ac092:
  pipe2_pinger_new_cold_8();
  pipe_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  pipe2_pinger_new(1);
  run_ping_pong_test();
  return;
}

Assistant:

static void pipe2_pinger_new(int vectored_writes) {
  uv_os_fd_t fds[2];
  pinger_t* pinger;
  uv_pipe_t* ponger;

  /* Try to make a pipe and do NUM_PINGS pings. */
  ASSERT_OK(uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
  ASSERT_EQ(uv_guess_handle(fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle(fds[1]), UV_NAMED_PIPE);

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ASSERT_OK(uv_pipe_init(uv_default_loop(), ponger, 0));
  ASSERT_OK(uv_pipe_open(ponger, fds[0]));

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0));
  ASSERT_OK(uv_pipe_open(&pinger->stream.pipe, fds[1]));
  pinger->stream.pipe.data = pinger; /* record for close_cb */
  ponger->data = pinger; /* record for read_cb */

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb));
}